

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
* __thiscall wallet::CWallet::GetScriptPubKeyMans(CWallet *this,CScript *script)

{
  __normal_iterator<wallet::ScriptPubKeyMan_*const_*,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>
  __first;
  anon_class_16_2_982005db __pred;
  bool bVar1;
  uint uVar2;
  LegacyScriptPubKeyMan *pLVar3;
  undefined8 in_RDX;
  _Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> in_RSI;
  SignatureData *in_RDI;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>,_bool> pVar4;
  LegacyScriptPubKeyMan *spkm;
  const_iterator *it;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *spk_mans;
  SignatureData sigdata;
  SignatureData *in_stack_fffffffffffffb68;
  unordered_map<CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>_>_>
  *in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  __normal_iterator<wallet::ScriptPubKeyMan_*const_*,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>
  in_stack_fffffffffffffb80;
  undefined7 in_stack_fffffffffffffb88;
  undefined1 in_stack_fffffffffffffb8f;
  direct_or_indirect *pdVar5;
  _Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> __last;
  const_iterator in_stack_fffffffffffffbf8;
  direct_or_indirect local_3b0 [33];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __last._M_node = (_Base_ptr)in_RDI;
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::set((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
         *)in_stack_fffffffffffffb68);
  local_3b0[0]._0_8_ =
       std::
       unordered_map<CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>_>_>
       ::find(in_stack_fffffffffffffb70,(key_type *)in_stack_fffffffffffffb68);
  pdVar5 = local_3b0;
  std::
  unordered_map<CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>,_SaltedSipHasher,_std::equal_to<CScript>,_std::allocator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>_>_>
  ::end(in_stack_fffffffffffffb70);
  bVar1 = std::__detail::operator==
                    ((_Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
                      *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                     (_Node_iterator_base<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_true>
                      *)in_stack_fffffffffffffb70);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::__detail::
    _Node_const_iterator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_false,_true>
    ::operator->((_Node_const_iterator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_false,_true>
                  *)in_stack_fffffffffffffb68);
    in_stack_fffffffffffffbf8 =
         std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>::begin
                   ((vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_> *
                    )in_stack_fffffffffffffb70);
    std::__detail::
    _Node_const_iterator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_false,_true>
    ::operator->((_Node_const_iterator<std::pair<const_CScript,_std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>_>,_false,_true>
                  *)in_stack_fffffffffffffb68);
    std::vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_>::end
              ((vector<wallet::ScriptPubKeyMan_*,_std::allocator<wallet::ScriptPubKeyMan_*>_> *)
               in_stack_fffffffffffffb70);
    __first._M_current._7_1_ = in_stack_fffffffffffffb8f;
    __first._M_current._0_7_ = in_stack_fffffffffffffb88;
    std::
    set<wallet::ScriptPubKeyMan*,std::less<wallet::ScriptPubKeyMan*>,std::allocator<wallet::ScriptPubKeyMan*>>
    ::
    insert<__gnu_cxx::__normal_iterator<wallet::ScriptPubKeyMan*const*,std::vector<wallet::ScriptPubKeyMan*,std::allocator<wallet::ScriptPubKeyMan*>>>>
              ((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                *)in_stack_fffffffffffffb68,__first,in_stack_fffffffffffffb80);
  }
  SignatureData::SignatureData((SignatureData *)in_stack_fffffffffffffbf8._M_current);
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::begin((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
           *)in_stack_fffffffffffffb70);
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::end((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
         *)in_stack_fffffffffffffb70);
  __pred.sigdata = in_RDI;
  __pred.script = (CScript *)pdVar5;
  std::
  all_of<std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan*>,wallet::CWallet::GetScriptPubKeyMans(CScript_const&)const::__0>
            (in_RSI,__last,__pred);
  inline_assertion_check<false,bool>
            ((bool *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88),
             (char *)in_stack_fffffffffffffb80._M_current,in_stack_fffffffffffffb7c,
             (char *)in_stack_fffffffffffffb70,&in_stack_fffffffffffffb68->complete);
  pLVar3 = GetLegacyScriptPubKeyMan
                     ((CWallet *)CONCAT17(in_stack_fffffffffffffb8f,in_stack_fffffffffffffb88));
  if ((pLVar3 != (LegacyScriptPubKeyMan *)0x0) &&
     (uVar2 = (*(pLVar3->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x16])
                        (pLVar3,in_RDX,local_3b0[0].direct + 0x18), (uVar2 & 1) != 0)) {
    pVar4 = std::
            set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
            ::insert((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                      *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78),
                     (value_type *)in_stack_fffffffffffffb70);
    local_3b0[0]._8_8_ = pVar4.first._M_node;
    local_3b0[0]._16_1_ = pVar4.second;
  }
  SignatureData::~SignatureData(in_stack_fffffffffffffb68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
            *)__last._M_node;
  }
  __stack_chk_fail();
}

Assistant:

std::set<ScriptPubKeyMan*> CWallet::GetScriptPubKeyMans(const CScript& script) const
{
    std::set<ScriptPubKeyMan*> spk_mans;

    // Search the cache for relevant SPKMs instead of iterating m_spk_managers
    const auto& it = m_cached_spks.find(script);
    if (it != m_cached_spks.end()) {
        spk_mans.insert(it->second.begin(), it->second.end());
    }
    SignatureData sigdata;
    Assume(std::all_of(spk_mans.begin(), spk_mans.end(), [&script, &sigdata](ScriptPubKeyMan* spkm) { return spkm->CanProvide(script, sigdata); }));

    // Legacy wallet
    LegacyScriptPubKeyMan* spkm = GetLegacyScriptPubKeyMan();
    if (spkm && spkm->CanProvide(script, sigdata)) spk_mans.insert(spkm);

    return spk_mans;
}